

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundogroup.cpp
# Opt level: O1

void __thiscall QUndoGroup::~QUndoGroup(QUndoGroup *this)

{
  iterator iVar1;
  iterator iVar2;
  QList<QUndoStack_*> *this_00;
  
  *(undefined ***)this = &PTR_metaObject_007f30b8;
  this_00 = (QList<QUndoStack_*> *)(*(long *)&this->field_0x8 + 0x80);
  iVar1 = QList<QUndoStack_*>::begin(this_00);
  iVar2 = QList<QUndoStack_*>::end(this_00);
  for (; iVar1.i != iVar2.i; iVar1.i = iVar1.i + 1) {
    *(undefined8 *)(*(long *)&(*iVar1.i)->field_0x8 + 0xb0) = 0;
  }
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

QUndoGroup::~QUndoGroup()
{
    // Ensure all QUndoStacks no longer refer to this group.
    Q_D(QUndoGroup);
    QList<QUndoStack *>::iterator it = d->stack_list.begin();
    QList<QUndoStack *>::iterator end = d->stack_list.end();
    while (it != end) {
        (*it)->d_func()->group = nullptr;
        ++it;
    }
}